

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void encode_b(AV1_COMP *cpi,TileDataEnc *tile_data,ThreadData_conflict *td,TokenExtra **tp,
             int mi_row,int mi_col,RUN_TYPE dry_run,BLOCK_SIZE bsize,PARTITION_TYPE partition,
             PICK_MODE_CONTEXT *ctx,int *rate)

{
  undefined4 uVar1;
  MB_MODE_INFO *mbmi_00;
  MOTION_MODE MVar2;
  uint8_t ref_frame_type;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  MB_MODE_INFO_EXT *mbmi_ext;
  long lVar7;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  char in_stack_00000008;
  byte in_stack_00000010;
  PARTITION_TYPE in_stack_00000018;
  MOTION_MODE motion_allowed;
  int seg_ref_active_1;
  int inter_block;
  int seg_ref_active;
  RD_COUNTS *rdc;
  int lf_id_1;
  int frame_lf_count_1;
  DeltaQInfo *delta_q_info;
  int super_block_upper_left;
  int lf_id;
  int frame_lf_count;
  MB_MODE_INFO *mbmi;
  undefined7 in_stack_00000060;
  int origin_mult;
  int subsampling_y;
  int subsampling_x;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  TileInfo *tile;
  AV1_COMMON *cm;
  MACROBLOCK *in_stack_ffffffffffffff50;
  MB_MODE_INFO_EXT_FRAME *mbmi_ext_best;
  WarpedMotionParams *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff64;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff66;
  MV_REFERENCE_FRAME in_stack_ffffffffffffff67;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 uVar8;
  undefined1 in_stack_ffffffffffffff6b;
  undefined2 in_stack_ffffffffffffff6c;
  AQ_MODE in_stack_ffffffffffffff6e;
  BLOCK_SIZE in_stack_ffffffffffffff6f;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  MACROBLOCK *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  TileInfo *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_68;
  
  av1_set_offsets_without_segment_id
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,
             (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
             (BLOCK_SIZE)((uint)in_stack_ffffffffffffff74 >> 0x18));
  uVar1 = *(undefined4 *)(in_RDX + 0x4218);
  setup_block_rdmult((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e,
                     (MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RDX + 0x2058);
  mbmi_00->partition = in_stack_00000018;
  av1_update_state((AV1_COMP *)tile,(ThreadData_conflict *)x,(PICK_MODE_CONTEXT *)xd,subsampling_x,
                   subsampling_y,origin_mult._3_1_,(RUN_TYPE)mi_col);
  if (in_stack_00000008 == '\0') {
    set_cb_offsets((uint16_t *)(*(long *)(in_RDX + 0x4178) + 0x4e),*(uint16_t *)(in_RDX + 0x4198),
                   *(uint16_t *)(in_RDX + 0x419a));
  }
  encode_superblock((AV1_COMP *)xd,(TileDataEnc *)CONCAT44(subsampling_x,subsampling_y),
                    (ThreadData_conflict *)CONCAT17(origin_mult._3_1_,in_stack_00000060),
                    (TokenExtra **)mbmi,frame_lf_count._3_1_,frame_lf_count._2_1_,
                    &tile->mi_row_start);
  if (in_stack_00000008 == '\0') {
    update_cb_offsets(in_stack_ffffffffffffff50,(BLOCK_SIZE)((ulong)_inter_block >> 0x38),
                      (int)_inter_block,0);
    if (((in_stack_00000010 == *(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c)) &&
        (mbmi_00->skip_txfm == '\x01')) && (*(int *)(in_RDI + 0x41ed8) != 0)) {
      iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
      iVar4 = 2;
      if (1 < iVar3) {
        iVar4 = 4;
      }
      for (local_68 = 0; local_68 < iVar4; local_68 = local_68 + 1) {
        mbmi_00->delta_lf[local_68] = *(int8_t *)(in_RDX + 0x2ba1 + (long)local_68);
      }
      mbmi_00->delta_lf_from_base = *(int8_t *)(in_RDX + 0x2ba0);
    }
    iVar3 = has_second_ref(mbmi_00);
    if (iVar3 != 0) {
      if ((((byte)((ushort)*(undefined2 *)&mbmi_00->field_0xa7 >> 9) & 1) == 0) ||
         ((mbmi_00->interinter_comp).type == '\0')) {
        *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfeff;
      }
      else {
        *(ushort *)&mbmi_00->field_0xa7 = *(ushort *)&mbmi_00->field_0xa7 & 0xfeff | 0x100;
      }
    }
    uVar8 = false;
    if ((in_R8D & *(int *)(*(long *)(in_RDI + 0x42008) + 0x20) - 1U) == 0) {
      uVar8 = (in_R9D & *(int *)(*(long *)(in_RDI + 0x42008) + 0x20) - 1U) == 0;
    }
    if ((((*(int *)(in_RDI + 0x41ed0) != 0) &&
         ((in_stack_00000010 != *(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c) ||
          (mbmi_00->skip_txfm == '\0')))) && ((bool)uVar8 != false)) &&
       (*(int *)(in_RDX + 0x2b84) = mbmi_00->current_qindex, *(int *)(in_RDI + 0x41ed8) != 0)) {
      if (*(int *)(in_RDI + 0x41ee0) == 0) {
        *(int8_t *)(in_RDX + 0x2ba0) = mbmi_00->delta_lf_from_base;
      }
      else {
        iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
        iVar4 = 2;
        if (1 < iVar3) {
          iVar4 = 4;
        }
        for (iVar3 = 0; iVar3 < iVar4; iVar3 = iVar3 + 1) {
          *(int8_t *)(in_RDX + 0x2ba1 + (long)iVar3) = mbmi_00->delta_lf[iVar3];
        }
      }
    }
    puVar5 = (undefined4 *)(in_RDX + 0x256c0);
    if ((*(ushort *)&mbmi_00->field_0xa7 >> 6 & 1) == 0) {
      iVar3 = segfeature_active((segmentation *)(in_RDI + 0x409b8),
                                (byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7,'\x05');
      if ((iVar3 == 0) &&
         (iVar4 = is_inter_block((MB_MODE_INFO *)in_stack_ffffffffffffff50), iVar4 != 0)) {
        av1_collect_neighbors_ref_counts
                  ((MACROBLOCKD *)
                   CONCAT17(in_stack_ffffffffffffff67,
                            CONCAT16(in_stack_ffffffffffffff66,
                                     CONCAT24(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)))
                  );
        if ((*(char *)(in_RDI + 0x3bf81) == '\x02') && (iVar4 = has_second_ref(mbmi_00), iVar4 != 0)
           ) {
          *puVar5 = 1;
        }
        set_ref_ptrs((AV1_COMMON *)CONCAT44(iVar3,in_stack_ffffffffffffff70),
                     (MACROBLOCKD *)
                     CONCAT17(in_stack_ffffffffffffff6f,
                              CONCAT16(in_stack_ffffffffffffff6e,
                                       CONCAT24(in_stack_ffffffffffffff6c,
                                                CONCAT13(in_stack_ffffffffffffff6b,
                                                         CONCAT12(uVar8,in_stack_ffffffffffffff68)))
                                      )),in_stack_ffffffffffffff67,in_stack_ffffffffffffff66);
      }
    }
    else {
      *(undefined4 *)(in_RDX + 0x256c4) = 1;
      if (*(char *)(in_RDI + 0x3bf81) == '\x02') {
        *puVar5 = 1;
      }
      set_ref_ptrs((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (MACROBLOCKD *)
                   CONCAT17(in_stack_ffffffffffffff6f,
                            CONCAT16(in_stack_ffffffffffffff6e,
                                     CONCAT24(in_stack_ffffffffffffff6c,
                                              CONCAT13(in_stack_ffffffffffffff6b,
                                                       CONCAT12(uVar8,in_stack_ffffffffffffff68)))))
                   ,in_stack_ffffffffffffff67,in_stack_ffffffffffffff66);
    }
    if (*(char *)(in_RSI + 0x5330) != '\0') {
      update_stats((AV1_COMMON *)xd,(ThreadData_conflict *)CONCAT44(subsampling_x,subsampling_y));
    }
    if (((0 < *(int *)(in_RDI + 0x60ae0)) && (*(int *)(in_RDI + 0x60ae0) < 0x7fffffff)) ||
       (((*(byte *)(in_RDI + 0x3c171) & 1) != 0 && (0 < *(int *)(in_RDI + 0x60ae4))))) {
      iVar3 = is_inter_block((MB_MODE_INFO *)in_stack_ffffffffffffff50);
      iVar4 = segfeature_active((segmentation *)(in_RDI + 0x409b8),
                                (byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7,'\x05');
      if ((iVar4 == 0) && (iVar3 != 0)) {
        if ((*(byte *)(in_RDI + 0x3c177) & 1) == 0) {
          MVar2 = '\0';
        }
        else {
          MVar2 = motion_mode_allowed(in_stack_ffffffffffffff58,
                                      (MACROBLOCKD *)in_stack_ffffffffffffff50,_inter_block,0);
        }
        if (mbmi_00->ref_frame[1] != '\0') {
          if (MVar2 != '\0') {
            lVar6 = in_RDX + 0x25b88 + (ulong)in_stack_00000010 * 8;
            lVar7 = (long)(int)(uint)(mbmi_00->motion_mode == '\x01');
            *(int *)(lVar6 + lVar7 * 4) = *(int *)(lVar6 + lVar7 * 4) + 1;
          }
          if (MVar2 == '\x02') {
            lVar6 = (long)(int)(uint)(mbmi_00->motion_mode == '\x02');
            *(int *)(in_RDX + 0x25c38 + lVar6 * 4) = *(int *)(in_RDX + 0x25c38 + lVar6 * 4) + 1;
          }
        }
      }
    }
  }
  mbmi_ext_best = *(MB_MODE_INFO_EXT_FRAME **)(in_RDX + 0x4178);
  mbmi_ext = (MB_MODE_INFO_EXT *)(in_RDX + 0x3c70);
  ref_frame_type = av1_ref_frame_type((MV_REFERENCE_FRAME *)_inter_block);
  av1_copy_mbmi_ext_to_mbmi_ext_frame(mbmi_ext_best,mbmi_ext,ref_frame_type);
  *(undefined4 *)(in_RDX + 0x4218) = uVar1;
  return;
}

Assistant:

static void encode_b(const AV1_COMP *const cpi, TileDataEnc *tile_data,
                     ThreadData *td, TokenExtra **tp, int mi_row, int mi_col,
                     RUN_TYPE dry_run, BLOCK_SIZE bsize,
                     PARTITION_TYPE partition, PICK_MODE_CONTEXT *const ctx,
                     int *rate) {
  const AV1_COMMON *const cm = &cpi->common;
  TileInfo *const tile = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const int subsampling_x = cm->seq_params->subsampling_x;
  const int subsampling_y = cm->seq_params->subsampling_y;

  av1_set_offsets_without_segment_id(cpi, tile, x, mi_row, mi_col, bsize);
  const int origin_mult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, NO_AQ, NULL);
  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->partition = partition;
  av1_update_state(cpi, td, ctx, mi_row, mi_col, bsize, dry_run);

  if (!dry_run) {
    set_cb_offsets(x->mbmi_ext_frame->cb_offset, x->cb_offset[PLANE_TYPE_Y],
                   x->cb_offset[PLANE_TYPE_UV]);
    assert(x->cb_offset[PLANE_TYPE_Y] <
           (1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]));
    assert(x->cb_offset[PLANE_TYPE_UV] <
           ((1 << num_pels_log2_lookup[cpi->common.seq_params->sb_size]) >>
            (subsampling_x + subsampling_y)));
  }

  encode_superblock(cpi, tile_data, td, tp, dry_run, bsize, rate);

  if (!dry_run) {
    update_cb_offsets(x, bsize, subsampling_x, subsampling_y);
    if (bsize == cpi->common.seq_params->sb_size && mbmi->skip_txfm == 1 &&
        cm->delta_q_info.delta_lf_present_flag) {
      const int frame_lf_count =
          av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
      for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id)
        mbmi->delta_lf[lf_id] = xd->delta_lf[lf_id];
      mbmi->delta_lf_from_base = xd->delta_lf_from_base;
    }
    if (has_second_ref(mbmi)) {
      if (mbmi->compound_idx == 0 ||
          mbmi->interinter_comp.type == COMPOUND_AVERAGE)
        mbmi->comp_group_idx = 0;
      else
        mbmi->comp_group_idx = 1;
    }

    // delta quant applies to both intra and inter
    const int super_block_upper_left =
        ((mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((mi_col & (cm->seq_params->mib_size - 1)) == 0);
    const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
    if (delta_q_info->delta_q_present_flag &&
        (bsize != cm->seq_params->sb_size || !mbmi->skip_txfm) &&
        super_block_upper_left) {
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }

    RD_COUNTS *rdc = &td->rd_counts;
    if (mbmi->skip_mode) {
      assert(!frame_is_intra_only(cm));
      rdc->skip_mode_used_flag = 1;
      if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
        assert(has_second_ref(mbmi));
        rdc->compound_ref_used_flag = 1;
      }
      set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    } else {
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active) {
        // If the segment reference feature is enabled we have only a single
        // reference frame allowed for the segment so exclude it from
        // the reference frame counts used to work out probabilities.
        if (is_inter_block(mbmi)) {
          av1_collect_neighbors_ref_counts(xd);
          if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
            if (has_second_ref(mbmi)) {
              // This flag is also updated for 4x4 blocks
              rdc->compound_ref_used_flag = 1;
            }
          }
          set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
        }
      }
    }

    if (tile_data->allow_update_cdf) update_stats(&cpi->common, td);

    // Gather obmc and warped motion count to update the probability.
    if ((cpi->sf.inter_sf.prune_obmc_prob_thresh > 0 &&
         cpi->sf.inter_sf.prune_obmc_prob_thresh < INT_MAX) ||
        (cm->features.allow_warped_motion &&
         cpi->sf.inter_sf.prune_warped_prob_thresh > 0)) {
      const int inter_block = is_inter_block(mbmi);
      const int seg_ref_active =
          segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_REF_FRAME);
      if (!seg_ref_active && inter_block) {
        const MOTION_MODE motion_allowed =
            cm->features.switchable_motion_mode
                ? motion_mode_allowed(xd->global_motion, xd, mbmi,
                                      cm->features.allow_warped_motion)
                : SIMPLE_TRANSLATION;

        if (mbmi->ref_frame[1] != INTRA_FRAME) {
          if (motion_allowed >= OBMC_CAUSAL) {
            td->rd_counts.obmc_used[bsize][mbmi->motion_mode == OBMC_CAUSAL]++;
          }
          if (motion_allowed == WARPED_CAUSAL) {
            td->rd_counts.warped_used[mbmi->motion_mode == WARPED_CAUSAL]++;
          }
        }
      }
    }
  }
  // TODO(Ravi/Remya): Move this copy function to a better logical place
  // This function will copy the best mode information from block
  // level (x->mbmi_ext) to frame level (cpi->mbmi_ext_info.frame_base). This
  // frame level buffer (cpi->mbmi_ext_info.frame_base) will be used during
  // bitstream preparation.
  av1_copy_mbmi_ext_to_mbmi_ext_frame(x->mbmi_ext_frame, &x->mbmi_ext,
                                      av1_ref_frame_type(xd->mi[0]->ref_frame));
  x->rdmult = origin_mult;
}